

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

uint16_t GetListenPort(void)

{
  CService *this;
  bool bVar1;
  DNSLookupFn dns_lookup_function;
  bool bVar2;
  uint16_t uVar3;
  string *name;
  string *psVar4;
  CChainParams *pCVar5;
  int64_t iVar6;
  uint16_t unaff_BX;
  long in_FS_OFFSET;
  optional<CService> bind_addr;
  NetWhitebindPermissions whitebind;
  undefined8 in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  pointer in_stack_ffffffffffffff30;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_c8;
  undefined1 local_a8 [40];
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  NetWhitebindPermissions local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"-bind",(allocator<char> *)&stack0xffffffffffffff20);
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68,&gArgs,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  psVar4 = (string *)CONCAT44(local_68._4_4_,local_68.super_NetPermissions.m_flags);
  do {
    name = psVar4;
    if (name == (string *)local_68.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect
       ) break;
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function(&local_c8,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff20;
    dns_lookup_function.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_ffffffffffffff18;
    dns_lookup_function.super__Function_base._M_manager = (_Manager_type)in_stack_ffffffffffffff28;
    dns_lookup_function._M_invoker = (_Invoker_type)in_stack_ffffffffffffff30;
    Lookup((optional<CService> *)local_a8,name,0,false,dns_lookup_function);
    std::_Function_base::~_Function_base(&local_c8.super__Function_base);
    bVar1 = true;
    if (local_80._0_1_ == true) {
      uVar3 = CService::GetPort((CService *)local_a8);
      if (uVar3 != 0) {
        unaff_BX = CService::GetPort((CService *)local_a8);
        bVar1 = false;
      }
    }
    std::_Optional_payload_base<CService>::_M_reset((_Optional_payload_base<CService> *)local_a8);
    psVar4 = name + 1;
  } while (bVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  if (name == (string *)local_68.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect)
  {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"-whitebind",(allocator<char> *)&local_68);
    ArgsManager::GetArgs
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xffffffffffffff20,&gArgs,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    this = &local_68.m_service;
    do {
      psVar4 = in_stack_ffffffffffffff20;
      if (psVar4 == in_stack_ffffffffffffff28) break;
      CService::CService(this);
      local_a8._0_8_ = local_a8 + 0x10;
      local_a8._8_8_ = 0;
      local_a8[0x10] = '\0';
      local_a8._32_8_ = &local_78;
      local_80 = 0;
      local_78._M_local_buf[0] = '\0';
      bVar2 = NetWhitebindPermissions::TryParse(psVar4,&local_68,(bilingual_str *)local_a8);
      bVar1 = true;
      if ((bVar2) && ((~local_68.super_NetPermissions.m_flags & 0x50) != 0)) {
        unaff_BX = CService::GetPort(this);
        bVar1 = false;
      }
      bilingual_str::~bilingual_str((bilingual_str *)local_a8);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)this);
      in_stack_ffffffffffffff20 = psVar4 + 1;
    } while (bVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffff20);
    if (psVar4 == in_stack_ffffffffffffff28) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a8,"-port",(allocator<char> *)&local_68);
      pCVar5 = Params();
      iVar6 = ArgsManager::GetIntArg(&gArgs,(string *)local_a8,(ulong)pCVar5->nDefaultPort);
      unaff_BX = (uint16_t)iVar6;
      std::__cxx11::string::~string((string *)local_a8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return unaff_BX;
  }
  __stack_chk_fail();
}

Assistant:

uint16_t GetListenPort()
{
    // If -bind= is provided with ":port" part, use that (first one if multiple are provided).
    for (const std::string& bind_arg : gArgs.GetArgs("-bind")) {
        constexpr uint16_t dummy_port = 0;

        const std::optional<CService> bind_addr{Lookup(bind_arg, dummy_port, /*fAllowLookup=*/false)};
        if (bind_addr.has_value() && bind_addr->GetPort() != dummy_port) return bind_addr->GetPort();
    }

    // Otherwise, if -whitebind= without NetPermissionFlags::NoBan is provided, use that
    // (-whitebind= is required to have ":port").
    for (const std::string& whitebind_arg : gArgs.GetArgs("-whitebind")) {
        NetWhitebindPermissions whitebind;
        bilingual_str error;
        if (NetWhitebindPermissions::TryParse(whitebind_arg, whitebind, error)) {
            if (!NetPermissions::HasFlag(whitebind.m_flags, NetPermissionFlags::NoBan)) {
                return whitebind.m_service.GetPort();
            }
        }
    }

    // Otherwise, if -port= is provided, use that. Otherwise use the default port.
    return static_cast<uint16_t>(gArgs.GetIntArg("-port", Params().GetDefaultPort()));
}